

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixels.c
# Opt level: O0

_Bool try_display_format(ALLEGRO_DISPLAY *display,int *format)

{
  _Bool _Var1;
  int format_00;
  int iVar2;
  int iVar3;
  int *in_RSI;
  ALLEGRO_DISPLAY *in_RDI;
  int bytes;
  int best_format;
  _Bool local_1;
  
  if (in_RDI == (ALLEGRO_DISPLAY *)0x0) {
    local_1 = false;
  }
  else {
    format_00 = al_get_display_format(in_RDI);
    _Var1 = _al_pixel_format_is_real(format_00);
    if (_Var1) {
      iVar2 = al_get_pixel_size(*in_RSI);
      if ((iVar2 == 0) || (iVar3 = al_get_pixel_size(format_00), iVar2 == iVar3)) {
        _Var1 = _al_pixel_format_has_alpha(*in_RSI);
        if ((!_Var1) || (_Var1 = _al_pixel_format_has_alpha(format_00), _Var1)) {
          _Var1 = _al_pixel_format_has_alpha(*in_RSI);
          if ((_Var1) || (_Var1 = _al_pixel_format_has_alpha(format_00), !_Var1)) {
            *in_RSI = format_00;
            local_1 = true;
          }
          else if (format_00 == 9) {
            *in_RSI = 0x17;
            local_1 = true;
          }
          else if (format_00 == 10) {
            *in_RSI = 0x16;
            local_1 = true;
          }
          else if (format_00 == 0x11) {
            *in_RSI = 0x12;
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else if (format_00 == 0x12) {
          *in_RSI = 0x11;
          local_1 = true;
        }
        else if (format_00 == 0x16) {
          *in_RSI = 10;
          local_1 = true;
        }
        else if (format_00 == 0x17) {
          *in_RSI = 9;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool try_display_format(ALLEGRO_DISPLAY *display, int *format)
{
   int best_format;
   int bytes;

   if (!display) {
      return false;
   }

   best_format = al_get_display_format(display);
   if (!_al_pixel_format_is_real(best_format))
      return false;

   bytes = al_get_pixel_size(*format);
   if (bytes && bytes != al_get_pixel_size(best_format))
      return false;

   if (_al_pixel_format_has_alpha(*format) &&
      !_al_pixel_format_has_alpha(best_format)) {
      switch (best_format) {
         case ALLEGRO_PIXEL_FORMAT_RGBX_8888:
            *format = ALLEGRO_PIXEL_FORMAT_RGBA_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_XRGB_8888:
             *format = ALLEGRO_PIXEL_FORMAT_ARGB_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_XBGR_8888:
            *format = ALLEGRO_PIXEL_FORMAT_ABGR_8888;
            return true;
         default:
            return false;
      }
   }
   if (!_al_pixel_format_has_alpha(*format) &&
      _al_pixel_format_has_alpha(best_format)) {
      switch (best_format) {
         case ALLEGRO_PIXEL_FORMAT_RGBA_8888:
            *format = ALLEGRO_PIXEL_FORMAT_RGBX_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_ARGB_8888:
             *format = ALLEGRO_PIXEL_FORMAT_XRGB_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_ABGR_8888:
            *format = ALLEGRO_PIXEL_FORMAT_XBGR_8888;
            return true;
         default:
            return false;
      }
   }
   *format = best_format;
   return true;
}